

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

TypeArray * __thiscall
ExpressionContext::GetArrayType(ExpressionContext *this,TypeBase *type,longlong length)

{
  long lVar1;
  TypeBase **ppTVar2;
  bool bVar3;
  int iVar4;
  TypeBase *pTVar5;
  undefined4 extraout_var;
  TypeHandle *pTVar6;
  TypeArray *pTVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  TypeArray *unaff_R12;
  InplaceStr name;
  undefined4 extraout_var_00;
  
  if (this->typeVoid == type) {
    __assert_fail("type != typeVoid",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x6a1,"TypeArray *ExpressionContext::GetArrayType(TypeBase *, long long)");
  }
  if (this->typeAuto == type) {
    __assert_fail("type != typeAuto",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x6a4,"TypeArray *ExpressionContext::GetArrayType(TypeBase *, long long)");
  }
  if (type != (TypeBase *)0x0) {
    if (type->typeID == 0x1b) {
LAB_001df879:
      __assert_fail("!isType<TypeArgumentSet>(type) && !isType<TypeMemberSet>(type) && !isType<TypeFunctionSet>(type)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x6a7,"TypeArray *ExpressionContext::GetArrayType(TypeBase *, long long)");
    }
    if (type != (TypeBase *)0x0) {
      if (type->typeID == 0x1c) goto LAB_001df879;
      if (type != (TypeBase *)0x0) {
        if (type->typeID == 0x1a) goto LAB_001df879;
        if (type != (TypeBase *)0x0) {
          if (type->typeID == 0) {
            __assert_fail("!isType<TypeError>(type)",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                          ,0x6a8,"TypeArray *ExpressionContext::GetArrayType(TypeBase *, long long)"
                         );
          }
          if ((type != (TypeBase *)0x0) && (pTVar5 = type, type->typeID == 0x18)) goto LAB_001df71d;
        }
      }
    }
  }
  pTVar5 = (TypeBase *)0x0;
LAB_001df71d:
  if ((pTVar5 != (TypeBase *)0x0) &&
     ((*(char *)&pTVar5[3]._vptr_TypeBase != '\x01' ||
      (*(char *)((long)&pTVar5[3]._vptr_TypeBase + 2) == '\x01')))) {
    __assert_fail("typeClass->completed && !typeClass->hasFinalizer",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x6ae,"TypeArray *ExpressionContext::GetArrayType(TypeBase *, long long)");
  }
  for (pTVar6 = (type->arrayTypes).head; pTVar6 != (TypeHandle *)0x0; pTVar6 = pTVar6->next) {
    pTVar7 = (TypeArray *)pTVar6->type;
    if ((pTVar7 == (TypeArray *)0x0) || ((pTVar7->super_TypeBase).typeID != 0x13)) {
      pTVar7 = (TypeArray *)0x0;
    }
    if ((pTVar7 == (TypeArray *)0x0) || (pTVar7->length != length)) {
      bVar3 = true;
    }
    else {
      bVar3 = false;
      unaff_R12 = pTVar7;
    }
    if (!bVar3) break;
  }
  if (pTVar6 == (TypeHandle *)0x0) {
    if (0xffff < type->size) {
      __assert_fail("type->size < 64 * 1024",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x6ba,"TypeArray *ExpressionContext::GetArrayType(TypeBase *, long long)");
    }
    iVar4 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x70);
    unaff_R12 = (TypeArray *)CONCAT44(extraout_var,iVar4);
    name = GetArrayTypeName(this,type,length);
    TypeArray::TypeArray(unaff_R12,name,type,length);
    uVar9 = type->alignment;
    (unaff_R12->super_TypeBase).alignment = uVar9;
    uVar10 = 4;
    if (4 < uVar9) {
      uVar10 = (ulong)uVar9;
    }
    lVar1 = (unaff_R12->super_TypeBase).size;
    lVar8 = lVar1 % (long)uVar10;
    if (lVar8 != 0) {
      uVar9 = (int)uVar10 - (int)lVar8;
      (unaff_R12->super_TypeBase).padding = uVar9;
      (unaff_R12->super_TypeBase).size = (ulong)uVar9 + lVar1;
    }
    iVar4 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x18);
    pTVar6 = (TypeHandle *)CONCAT44(extraout_var_00,iVar4);
    pTVar6->type = (TypeBase *)unaff_R12;
    pTVar6->next = (TypeHandle *)0x0;
    pTVar6->listed = false;
    IntrusiveList<TypeHandle>::push_back(&type->arrayTypes,pTVar6);
    uVar9 = (this->types).count;
    if (uVar9 == (this->types).max) {
      SmallArray<TypeBase_*,_128U>::grow(&this->types,uVar9);
    }
    ppTVar2 = (this->types).data;
    if (ppTVar2 == (TypeBase **)0x0) {
      __assert_fail("data",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x162,
                    "void SmallArray<TypeBase *, 128>::push_back(const T &) [T = TypeBase *, N = 128]"
                   );
    }
    uVar9 = (this->types).count;
    (this->types).count = uVar9 + 1;
    ppTVar2[uVar9] = (TypeBase *)unaff_R12;
  }
  return unaff_R12;
}

Assistant:

TypeArray* ExpressionContext::GetArrayType(TypeBase* type, long long length)
{
	// Can't have array of void
	assert(type != typeVoid);

	// Can't have array of auto
	assert(type != typeAuto);

	// Can't derive from pseudo types
	assert(!isType<TypeArgumentSet>(type) && !isType<TypeMemberSet>(type) && !isType<TypeFunctionSet>(type));
	assert(!isType<TypeError>(type));

	if(TypeClass *typeClass = getType<TypeClass>(type))
	{
		(void)typeClass;

		assert(typeClass->completed && !typeClass->hasFinalizer);
	}

	for(TypeHandle *curr = type->arrayTypes.head; curr; curr = curr->next)
	{
		if(TypeArray *typeArray = getType<TypeArray>(curr->type))
		{
			if(typeArray->length == length)
				return typeArray;
		}
	}

	assert(type->size < 64 * 1024);

	// Create new type
	TypeArray* result = new (get<TypeArray>()) TypeArray(GetArrayTypeName(*this, type, length), type, length);

	result->alignment = type->alignment;

	unsigned maximumAlignment = result->alignment < 4 ? 4 : result->alignment;

	if(result->size % maximumAlignment != 0)
	{
		result->padding = maximumAlignment - (result->size % maximumAlignment);
		result->size += result->padding;
	}

	// Save it for future use
	type->arrayTypes.push_back(new (get<TypeHandle>()) TypeHandle(result));

	types.push_back(result);

	return result;
}